

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void litroom(boolean on,obj *obj)

{
  char cVar1;
  permonst *ppVar2;
  bool bVar3;
  boolean bVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  undefined1 *puVar8;
  int iVar9;
  int iVar10;
  obj *obj_00;
  char is_lit;
  undefined1 local_31;
  
  if (on != '\0') {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if ((u._1052_1_ & 1) != 0) {
        ppVar2 = (u.ustuck)->data;
        if ((ppVar2->mflags1 & 0x40000) == 0) {
          cVar1 = ppVar2->mlet;
          pcVar5 = Monnam(u.ustuck);
          if (ppVar2 == mons + 0x9f || cVar1 == '\x16') {
            pcVar7 = "%s shines briefly.";
          }
          else {
            pcVar7 = "%s glistens.";
          }
          pline(pcVar7,pcVar5);
          return;
        }
        pcVar5 = Monnam(u.ustuck);
        pcVar5 = s_suffix(pcVar5);
        pcVar7 = mbodypart(u.ustuck,0x12);
        pline("%s %s is lit.",pcVar5,pcVar7);
        return;
      }
      pline("A lit field surrounds you!");
    }
    goto LAB_0022f87a;
  }
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((obj_00 = invent, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    if ((u._1052_1_ & 1) == 0) {
      if (((uwep == (obj *)0x0) || (bVar4 = artifact_light(uwep), bVar4 == '\0')) ||
         ((uwep->field_0x4c & 8) == 0)) {
        pline("You are surrounded by darkness!");
        obj_00 = invent;
      }
      else {
        pcVar5 = xname(uwep);
        pcVar5 = the(pcVar5);
        pline("Suddenly, the only light left comes from %s!",pcVar5);
        obj_00 = invent;
      }
      goto LAB_0022f790;
    }
    pline("It seems even darker in here than before.");
    iVar10 = 1;
  }
  else {
LAB_0022f790:
    for (; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
      if ((obj_00->field_0x4c & 8) != 0) {
        snuff_lit(obj_00);
      }
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((iVar10 = 5, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      iVar10 = 0;
    }
  }
  if ((iVar10 != 0) && (iVar10 != 5)) {
    return;
  }
LAB_0022f87a:
  if (((u._1052_1_ & 2) == 0) &&
     (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 == '\0')) {
    if ((uball != (obj *)0x0 && on == '\0') &&
       (((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      move_bc(1,0,uball->ox,uball->oy,uchain->ox,uchain->oy);
    }
    bVar4 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar4 == '\0') {
      iVar10 = 5;
      if ((obj != (obj *)0x0) && (obj->oclass == '\t')) {
        iVar10 = (uint)((obj->field_0x4a & 2) >> 1) * 4 + 5;
      }
      puVar8 = &local_31;
      if (on == '\0') {
        puVar8 = (undefined1 *)0x0;
      }
      do_clear_area((int)u.ux,(int)u.uy,iVar10,set_lit,puVar8);
    }
    else {
      uVar6 = *(ushort *)&level->locations[u.ux][u.uy].field_0x8 & 0x3f;
      if (2 < uVar6) {
        uVar6 = uVar6 - 3;
        iVar10 = level->rooms[uVar6].lx + -1;
        if (iVar10 <= level->rooms[uVar6].hx + 1) {
          puVar8 = &local_31;
          if (on == '\0') {
            puVar8 = (undefined1 *)0x0;
          }
          do {
            iVar9 = (int)level->rooms[uVar6].ly;
            if (iVar9 + -1 <= level->rooms[uVar6].hy + 1) {
              iVar9 = iVar9 + -2;
              do {
                iVar9 = iVar9 + 1;
                set_lit(iVar10,iVar9,puVar8);
              } while (iVar9 <= level->rooms[uVar6].hy);
            }
            bVar3 = iVar10 <= level->rooms[uVar6].hx;
            iVar10 = iVar10 + 1;
          } while (bVar3);
        }
        level->rooms[uVar6].rlit = on;
      }
    }
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (vision_recalc(2), uball != (obj *)0x0 && on == '\0')) {
      move_bc(0,0,uball->ox,uball->oy,uchain->ox,uchain->oy);
    }
    vision_full_recalc = '\x01';
  }
  return;
}

Assistant:

void litroom(boolean on, struct obj *obj)
{
	char is_lit;	/* value is irrelevant; we use its address
			   as a `not null' flag for set_lit() */

	/* first produce the text (provided you're not blind) */
	if (!on) {
		struct obj *otmp;

		if (!Blind) {
		    if (u.uswallow) {
			pline("It seems even darker in here than before.");
			return;
		    }
		    if (uwep && artifact_light(uwep) && uwep->lamplit)
			pline("Suddenly, the only light left comes from %s!",
				the(xname(uwep)));
		    else
			pline("You are surrounded by darkness!");
		}

		/* the magic douses lamps, et al, too */
		for (otmp = invent; otmp; otmp = otmp->nobj)
		    if (otmp->lamplit)
			snuff_lit(otmp);
		if (Blind) goto do_it;
	} else {
		if (Blind) goto do_it;
		if (u.uswallow){
			if (is_animal(u.ustuck->data))
				pline("%s %s is lit.",
				        s_suffix(Monnam(u.ustuck)),
					mbodypart(u.ustuck, STOMACH));
			else
				if (is_whirly(u.ustuck->data))
					pline("%s shines briefly.",
					      Monnam(u.ustuck));
				else
					pline("%s glistens.", Monnam(u.ustuck));
			return;
		}
		pline("A lit field surrounds you!");
	}

do_it:
	/* No-op in water - can only see the adjacent squares and that's it! */
	if (Underwater || Is_waterlevel(&u.uz)) return;
	/*
	 *  If we are darkening the room and the hero is punished but not
	 *  blind, then we have to pick up and replace the ball and chain so
	 *  that we don't remember them if they are out of sight.
	 */
	if (Punished && !on && !Blind)
	    move_bc(1, 0, uball->ox, uball->oy, uchain->ox, uchain->oy);

	if (Is_rogue_level(&u.uz)) {
	    /* Can't use do_clear_area because MAX_RADIUS is too small */
	    /* rogue lighting must light the entire room */
	    int rnum = level->locations[u.ux][u.uy].roomno - ROOMOFFSET;
	    int rx, ry;
	    if (rnum >= 0) {
		for (rx = level->rooms[rnum].lx-1; rx <= level->rooms[rnum].hx+1; rx++)
		    for (ry = level->rooms[rnum].ly-1; ry <= level->rooms[rnum].hy+1; ry++)
			set_lit(rx, ry,
				(on ? &is_lit : NULL));
		level->rooms[rnum].rlit = on;
	    }
	    /* hallways remain dark on the rogue level */
	} else
	    do_clear_area(u.ux,u.uy,
		(obj && obj->oclass==SCROLL_CLASS && obj->blessed) ? 9 : 5,
		set_lit, (on ? &is_lit : NULL));

	/*
	 *  If we are not blind, then force a redraw on all positions in sight
	 *  by temporarily blinding the hero.  The vision recalculation will
	 *  correctly update all previously seen positions *and* correctly
	 *  set the waslit bit [could be messed up from above].
	 */
	if (!Blind) {
	    vision_recalc(2);

	    /* replace ball&chain */
	    if (Punished && !on)
		move_bc(0, 0, uball->ox, uball->oy, uchain->ox, uchain->oy);
	}

	vision_full_recalc = 1;	/* delayed vision recalculation */
}